

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

bool __thiscall QMdiArea::eventFilter(QMdiArea *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  Data *pDVar3;
  QObject *pQVar4;
  QMdiAreaPrivate *pQVar5;
  undefined8 uVar6;
  QMdiAreaTabBar *pQVar7;
  bool bVar8;
  short sVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  QWidget *pQVar13;
  QMdiArea *pQVar14;
  qsizetype qVar15;
  QWidget *parent;
  long in_FS_OFFSET;
  QMdiSubWindow *subWindow;
  undefined1 local_58 [24];
  QWidget *local_40;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
LAB_004434c3:
      bVar8 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
      return bVar8;
    }
    goto LAB_00443882;
  }
  if ((*(ushort *)(event + 8) & 0xfffe) == 6) {
    uVar10 = QKeyEvent::modifiers();
    if (((uVar10 >> 0x1a & 1) != 0) || (*(int *)(event + 0x40) == 0x1000021)) {
      for (lVar2 = *(long *)(*(long *)(object + 8) + 0x10); lVar2 != 0;
          lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x10)) {
        lVar12 = QMetaObject::cast((QObject *)&staticMetaObject);
        if (lVar12 != 0) {
          iVar11 = *(int *)(event + 0x40);
          if (iVar11 + 0xfeffffffU < 2) {
            bVar8 = true;
            if (*(short *)(event + 8) == 6) {
              QMdiAreaPrivate::highlightNextSubWindow
                        (*(QMdiAreaPrivate **)(lVar12 + 8),(uint)(iVar11 == 0x1000001) * 2 + -1);
            }
            goto LAB_00443854;
          }
          if (iVar11 == 0x1000000) {
            lVar2 = *(long *)(lVar12 + 8);
            pQVar13 = *(QWidget **)(lVar2 + 0x318);
            if ((pQVar13 != (QWidget *)0x0) && ((pQVar13->data->widget_attributes & 0x8000) != 0)) {
              QWidget::hide(pQVar13);
            }
            *(undefined4 *)(lVar2 + 0x3d8) = 0xffffffff;
          }
          else if (iVar11 == 0x1000021) {
            pQVar5 = *(QMdiAreaPrivate **)(lVar12 + 8);
            if (*(short *)(event + 8) == 6) {
              uVar6 = *(undefined8 *)
                       &(pQVar5->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
              iVar11 = QApplication::keyboardInputInterval();
              QBasicTimer::start(&pQVar5->tabToPreviousTimer,(long)iVar11 * 1000000,1,uVar6);
            }
            else {
              QMdiAreaPrivate::activateHighlightedWindow(pQVar5);
            }
          }
          break;
        }
      }
    }
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) goto LAB_004434c3;
    goto LAB_00443882;
  }
  pQVar5 = *(QMdiAreaPrivate **)
            &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar13 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
  local_40 = pQVar13;
  if (pQVar13 == (QWidget *)0x0) {
    sVar9 = *(short *)(event + 8);
    if (sVar9 == 0x79) {
      pDVar3 = (pQVar5->active).wp.d;
      if ((((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
          ((pQVar5->active).wp.value == (QObject *)0x0)) &&
         ((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
          0x8000) != 0)) {
        pQVar13 = QWidget::window((QWidget *)this);
        bVar8 = QWidget::isMinimized(pQVar13);
        if (bVar8) {
          sVar9 = *(short *)(event + 8);
          goto LAB_004435b7;
        }
        QMdiAreaPrivate::activateCurrentWindow(pQVar5);
      }
    }
    else {
LAB_004435b7:
      if (((sVar9 == 0x7a) && (pDVar3 = (pQVar5->active).wp.d, pDVar3 != (Data *)0x0)) &&
         ((*(int *)(pDVar3 + 4) != 0 &&
          ((pQVar4 = (pQVar5->active).wp.value, pQVar4 != (QObject *)0x0 &&
           (*(int *)(pDVar3 + 4) != 0)))))) {
        QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)(pQVar4 + 8),false,false);
      }
    }
    goto switchD_00443531_caseD_f;
  }
  pQVar14 = QMdiSubWindow::mdiArea((QMdiSubWindow *)pQVar13);
  if (pQVar14 != this) goto switchD_00443531_caseD_f;
  uVar1 = *(ushort *)(event + 8);
  if (0x20 < uVar1) {
    if (uVar1 == 0x21) {
LAB_004436b5:
      pQVar7 = pQVar5->tabBar;
      if (pQVar7 != (QMdiAreaTabBar *)0x0) {
        qVar15 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                           (&pQVar5->childWindows,(QMdiSubWindow **)&local_40,0);
        tabTextFor((QString *)local_58,(QMdiSubWindow *)local_40);
        QTabBar::setTabText(&pQVar7->super_QTabBar,(int)qVar15,(QString *)local_58);
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_58._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
          }
        }
      }
    }
    else if (uVar1 == 0x22) {
      pQVar7 = pQVar5->tabBar;
      if (pQVar7 != (QMdiAreaTabBar *)0x0) {
        qVar15 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                           (&pQVar5->childWindows,(QMdiSubWindow **)&local_40,0);
        QWidget::windowIcon((QWidget *)local_58);
        QTabBar::setTabIcon(&pQVar7->super_QTabBar,(int)qVar15,(QIcon *)local_58);
        QIcon::~QIcon((QIcon *)local_58);
      }
    }
    else if (uVar1 == 0x66) goto LAB_004436b5;
    goto switchD_00443531_caseD_f;
  }
  switch(uVar1) {
  case 0xd:
  case 0xe:
    if (pQVar5->tileCalledFromResizeEvent != false) break;
    QMdiAreaPrivate::updateScrollBars(pQVar5);
    bVar8 = QWidget::isMinimized(pQVar13);
    if (bVar8) break;
    goto LAB_004437c0;
  case 0x11:
    if (pQVar5->tabBar != (QMdiAreaTabBar *)0x0) {
      qVar15 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                         (&pQVar5->childWindows,(QMdiSubWindow **)&local_40,0);
      bVar8 = QTabBar::isTabEnabled(&pQVar5->tabBar->super_QTabBar,(int)qVar15);
      if (!bVar8) {
        QTabBar::setTabEnabled(&pQVar5->tabBar->super_QTabBar,(int)qVar15,true);
      }
    }
  case 0x12:
    if (event[0xb] == (QEvent)0x0) {
LAB_004437c0:
      pQVar5->isSubWindowsTiled = false;
    }
    break;
  case 0x13:
    qVar15 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                       (&pQVar5->childWindows,(QMdiSubWindow **)&local_40,0);
    if (qVar15 == pQVar5->indexToHighlighted) {
      QMdiAreaPrivate::hideRubberBand(pQVar5);
    }
  }
switchD_00443531_caseD_f:
  bVar8 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
LAB_00443854:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_00443882:
  __stack_chk_fail();
}

Assistant:

bool QMdiArea::eventFilter(QObject *object, QEvent *event)
{
    if (!object)
        return QAbstractScrollArea::eventFilter(object, event);

    Q_D(QMdiArea);
    // Global key events with Ctrl modifier.
    if (event->type() == QEvent::KeyPress || event->type() == QEvent::KeyRelease) {

        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        // Ignore key events without a Ctrl modifier (except for press/release on the modifier itself).
        if (!(keyEvent->modifiers() & Qt::ControlModifier) && keyEvent->key() != Qt::Key_Control)
            return QAbstractScrollArea::eventFilter(object, event);

        // Find closest mdi area (in case we have a nested workspace).
        QMdiArea *area = mdiAreaParent(static_cast<QWidget *>(object));
        if (!area)
            return QAbstractScrollArea::eventFilter(object, event);

        const bool keyPress = (event->type() == QEvent::KeyPress);

        // 1) Ctrl-Tab once -> activate the previously active window.
        // 2) Ctrl-Tab (Tab, Tab, ...) -> iterate through all windows (activateNextSubWindow()).
        // 3) Ctrl-Shift-Tab (Tab, Tab, ...) -> iterate through all windows in the opposite
        //    direction (activatePreviousSubWindow())
        switch (keyEvent->key()) {
        case Qt::Key_Control:
            if (keyPress)
                area->d_func()->startTabToPreviousTimer();
            else
                area->d_func()->activateHighlightedWindow();
            break;
        case Qt::Key_Tab:
        case Qt::Key_Backtab:
            if (keyPress)
                area->d_func()->highlightNextSubWindow(keyEvent->key() == Qt::Key_Tab ? 1 : -1);
            return true;
#if QT_CONFIG(rubberband)
        case Qt::Key_Escape:
            area->d_func()->hideRubberBand();
            break;
#endif
        default:
            break;
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    QMdiSubWindow *subWindow = qobject_cast<QMdiSubWindow *>(object);

    if (!subWindow) {
        // QApplication events:
        if (event->type() == QEvent::ApplicationActivate && !d->active
            && isVisible() && !window()->isMinimized()) {
            d->activateCurrentWindow();
        } else if (event->type() == QEvent::ApplicationDeactivate && d->active) {
            d->setActive(d->active, false, false);
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    if (subWindow->mdiArea() != this)
        return QAbstractScrollArea::eventFilter(object, event);

    // QMdiSubWindow events:
    switch (event->type()) {
    case QEvent::Move:
    case QEvent::Resize:
        if (d->tileCalledFromResizeEvent)
            break;
        d->updateScrollBars();
        if (!subWindow->isMinimized())
            d->isSubWindowsTiled = false;
        break;
    case QEvent::Show:
#if QT_CONFIG(tabbar)
        if (d->tabBar) {
            const int tabIndex = d->childWindows.indexOf(subWindow);
            if (!d->tabBar->isTabEnabled(tabIndex))
                d->tabBar->setTabEnabled(tabIndex, true);
        }
#endif // QT_CONFIG(tabbar)
        Q_FALLTHROUGH();
    case QEvent::Hide:
        // Do not reset the isSubWindowsTiled flag if the event is a spontaneous system window event.
        // This ensures that tiling will be performed during the resizeEvent after an application
        // window minimize (hide) and then restore (show).
        if (!event->spontaneous())
            d->isSubWindowsTiled = false;
        break;
#if QT_CONFIG(rubberband)
    case QEvent::Close:
        if (d->childWindows.indexOf(subWindow) == d->indexToHighlighted)
            d->hideRubberBand();
        break;
#endif
#if QT_CONFIG(tabbar)
    case QEvent::WindowTitleChange:
    case QEvent::ModifiedChange:
        if (d->tabBar)
            d->tabBar->setTabText(d->childWindows.indexOf(subWindow), tabTextFor(subWindow));
        break;
    case QEvent::WindowIconChange:
        if (d->tabBar)
            d->tabBar->setTabIcon(d->childWindows.indexOf(subWindow), subWindow->windowIcon());
        break;
#endif // QT_CONFIG(tabbar)
    default:
        break;
    }
    return QAbstractScrollArea::eventFilter(object, event);
}